

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluChangePhase(word *pF,int nVars,int iVar)

{
  word wVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar7 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                  ,0x1ba,"void If_CluChangePhase(word *, int, int)");
  }
  if (iVar < 6) {
    uVar6 = 0;
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
      pF[uVar6] = (Truth6[iVar] & pF[uVar6]) >> (bVar3 & 0x3f) |
                  (~Truth6[iVar] & pF[uVar6]) << (bVar3 & 0x3f);
    }
  }
  else {
    bVar3 = (byte)iVar - 6;
    uVar2 = 1 << (bVar3 & 0x1f);
    iVar5 = 2 << (bVar3 & 0x1f);
    iVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    for (; iVar4 < (int)uVar7; iVar4 = iVar4 + iVar5) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        wVar1 = pF[uVar8];
        pF[uVar8] = pF[(long)(int)uVar2 + uVar8];
        pF[(long)(int)uVar2 + uVar8] = wVar1;
      }
      pF = pF + iVar5;
    }
  }
  return;
}

Assistant:

void If_CluChangePhase( word * pF, int nVars, int iVar )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pF[i] = ((pF[i] & ~Truth6[iVar]) << Shift) | ((pF[i] & Truth6[iVar]) >> Shift);
    }
    else
    {
        word Temp;
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Temp = pF[i];
                pF[i] = pF[Step+i];
                pF[Step+i] = Temp;
            }
            pF += 2*Step;
        }
    }
}